

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptArray::BigIndex::DeleteItem(BigIndex *this,JavascriptArray *arr)

{
  uint32 itemIndex;
  Type TVar1;
  Type *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  itemIndex = this->index;
  pTVar2 = (arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  if (itemIndex == 0xffffffff) {
    JavascriptOperators::GetPropertyIdForInt
              (this->bigIndex,
               (((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
               &local_20);
    iVar6 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x21])(arr,(ulong)(uint)local_20->pid,0);
  }
  else {
    TVar1 = pTVar2->typeId;
    if (TVar1 == TypeIds_ArrayLast) {
      BVar5 = DirectDeleteItemAt<double>(arr,itemIndex);
      return BVar5;
    }
    if (TVar1 == TypeIds_NativeIntArray) {
      BVar5 = DirectDeleteItemAt<int>(arr,itemIndex);
      return BVar5;
    }
    if (TVar1 == TypeIds_Array) {
      BVar5 = DirectDeleteItemAt<void*>(arr,itemIndex);
      return BVar5;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                ,0x6b4,"(0)","FALSE");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

BOOL JavascriptArray::BigIndex::DeleteItem(JavascriptArray* arr) const
    {
        if (IsSmallIndex())
        {
            return small_index::DeleteItem(arr, index);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            return arr->DeleteProperty(propertyRecord->GetPropertyId(), PropertyOperation_None);
        }
    }